

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * getStringCompressionType_abi_cxx11_
                   (string *__return_storage_ptr__,CompressionType compression)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (compression == LZ4) {
    __s = "lz4";
    __a = &local_b;
  }
  else if (compression == BZ2) {
    __s = "bz2";
    __a = &local_a;
  }
  else if (compression == Uncompressed) {
    __s = "none";
    __a = &local_9;
  }
  else {
    __s = "Unknown";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getStringCompressionType(minibag::CompressionType compression)
{
    switch(compression)
    {
    case minibag::compression::Uncompressed: return "none";
    case minibag::compression::BZ2: return "bz2";
    case minibag::compression::LZ4: return "lz4";
    default: return "Unknown";
    }
}